

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree-inl.hh
# Opt level: O0

long * __thiscall
phosg::KDTree<phosg::Vector2<long>,_long>::at
          (KDTree<phosg::Vector2<long>,_long> *this,Vector2<long> *pt)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  out_of_range *this_00;
  Node *local_40;
  Node *local_20;
  Node *n;
  Vector2<long> *pt_local;
  KDTree<phosg::Vector2<long>,_long> *this_local;
  
  local_20 = this->root;
  while( true ) {
    if (local_20 == (Node *)0x0) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      ::std::out_of_range::out_of_range(this_00,"no such item");
      __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
    }
    bVar1 = Vector2<long>::operator==(&local_20->pt,pt);
    if (bVar1) break;
    lVar2 = Vector2<long>::at(pt,local_20->dim);
    lVar3 = Vector2<long>::at(&local_20->pt,local_20->dim);
    if (lVar2 < lVar3) {
      local_40 = local_20->before;
    }
    else {
      local_40 = local_20->after_or_equal;
    }
    local_20 = local_40;
  }
  return &local_20->value;
}

Assistant:

const ValueType& KDTree<CoordType, ValueType>::at(
    const CoordType& pt) const {
  for (Node* n = this->root; n;) {
    if (n->pt == pt) {
      return n->value;
    }
    n = (pt.at(n->dim) < n->pt.at(n->dim)) ? n->before : n->after_or_equal;
  }
  throw std::out_of_range("no such item");
}